

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppEVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  TimeInMillis TVar9;
  TimeInMillis TVar10;
  TestCase *this_00;
  int i;
  uint uVar11;
  byte bVar12;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  pointer ppEVar13;
  int test_index;
  
  bVar4 = GTestIsInitialized();
  if (g_help_flag == '\0') {
    PostFlagParsingInit(this);
    WriteToShardStatusFileIfNeeded();
    pIVar1 = (this->internal_run_death_test_flag_).ptr_;
    bVar5 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                        pIVar1 != (InternalRunDeathTestFlag *)0x0);
    iVar6 = FilterTests(this,(uint)!bVar5);
    if (FLAGS_gtest_list_tests != '\x01') {
      iVar7 = 0;
      if (FLAGS_gtest_shuffle == '\x01') {
        iVar7 = GetRandomSeedFromFlag(FLAGS_gtest_random_seed);
      }
      this->random_seed_ = iVar7;
      pTVar2 = (this->listeners_).repeater_;
      TVar9 = GetTimeInMillis();
      this->start_timestamp_ = TVar9;
      (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2,this->parent_);
      uVar8 = FLAGS_gtest_repeat;
      if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
        uVar8 = 1;
      }
      bVar12 = 0;
      for (uVar11 = 0; uVar11 != uVar8 || (int)uVar8 < 0; uVar11 = uVar11 + 1) {
        ClearNonAdHocTestResult(this);
        TVar9 = GetTimeInMillis();
        if (iVar6 < 1) {
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                    (pTVar2,this->parent_,(ulong)uVar11);
        }
        else {
          if (FLAGS_gtest_shuffle == '\x01') {
            (this->random_).state_ = this->random_seed_;
            ShuffleTests(this);
          }
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                    (pTVar2,this->parent_,(ulong)uVar11);
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
          ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                    (&this->environments_,SetUpEnvironment);
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
          bVar5 = Test::HasFatalFailure();
          if (!bVar5) {
            for (iVar7 = 0;
                iVar7 < (int)((ulong)((long)(this->test_cases_).
                                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->test_cases_).
                                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
                iVar7 = iVar7 + 1) {
              this_00 = GetMutableTestCase(this,iVar7);
              TestCase::Run(this_00);
            }
          }
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xb])(pTVar2,this->parent_);
          ppEVar3 = (this->environments_).
                    super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (ppEVar13 = (this->environments_).
                          super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish; ppEVar13 != ppEVar3;
              ppEVar13 = ppEVar13 + -1) {
            (**(code **)(*(long *)ppEVar13[-1] + 0x18))();
          }
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar2,this->parent_);
        }
        TVar10 = GetTimeInMillis();
        this->elapsed_time_ = TVar10 - TVar9;
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])
                  (pTVar2,this->parent_,(ulong)uVar11);
        bVar5 = Passed(this);
        UnshuffleTests(this);
        if (FLAGS_gtest_shuffle == '\x01') {
          iVar7 = GetNextRandomSeed(this->random_seed_);
          this->random_seed_ = iVar7;
        }
        bVar12 = bVar12 | !bVar5;
      }
      (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2,this->parent_);
      if (!bVar4) {
        ColoredPrintf(COLOR_RED,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
      return (bool)(bVar12 ^ 1);
    }
    ListTestsMatchingFilter(this);
  }
  return true;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True iff Google Test is initialized before RUN_ALL_TESTS() is called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True iff we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_.get() != NULL);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG(shuffle) ?
      GetRandomSeedFromFlag(GTEST_FLAG(random_seed)) : 0;

  // True iff at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG(repeat);
  // Repeats forever if the repeat count is negative.
  const bool forever = repeat < 0;
  for (int i = 0; forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    const TimeInMillis start = GetTimeInMillis();

    // Shuffles test cases and tests if requested.
    if (has_tests_to_run && GTEST_FLAG(shuffle)) {
      random()->Reseed(random_seed_);
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test case if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand.
      repeater->OnEnvironmentsSetUpStart(*parent_);
      ForEach(environments_, SetUpEnvironment);
      repeater->OnEnvironmentsSetUpEnd(*parent_);

      // Runs the tests only if there was no fatal failure during global
      // set-up.
      if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_case_count();
             test_index++) {
          GetMutableTestCase(test_index)->Run();
        }
      }

      // Tears down all environments in reverse order afterwards.
      repeater->OnEnvironmentsTearDownStart(*parent_);
      std::for_each(environments_.rbegin(), environments_.rend(),
                    TearDownEnvironment);
      repeater->OnEnvironmentsTearDownEnd(*parent_);
    }

    elapsed_time_ = GetTimeInMillis() - start;

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        COLOR_RED,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
#if GTEST_FOR_GOOGLE_
    ColoredPrintf(COLOR_RED,
                  "For more details, see http://wiki/Main/ValidGUnitMain.\n");
#endif  // GTEST_FOR_GOOGLE_
  }

  return !failed;
}